

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

Path * __thiscall fs::Path::removeLastPath(Path *this)

{
  Path *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_back(&this->_path);
  updatePath(this);
  return this;
}

Assistant:

fs::Path& fs::Path::removeLastPath()
{
  _path.pop_back();
  updatePath();
  return *this;
}